

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

Classifer __thiscall CLI::App::_recognize(App *this,string *current)

{
  bool bVar1;
  int iVar2;
  Classifer CVar3;
  string dummy2;
  string dummy1;
  string local_68;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  iVar2 = ::std::__cxx11::string::compare((char *)current);
  if (iVar2 == 0) {
    CVar3 = POSITIONAL_MARK;
  }
  else {
    bVar1 = _valid_subcommand(this,current);
    CVar3 = SUBCOMMAND;
    if (!bVar1) {
      bVar1 = detail::split_long(current,&local_48,&local_68);
      CVar3 = LONG;
      if (!bVar1) {
        bVar1 = detail::split_short(current,&local_48,&local_68);
        CVar3 = (uint)bVar1 * 2;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return CVar3;
}

Assistant:

detail::Classifer _recognize(const std::string &current) const {
        std::string dummy1, dummy2;

        if(current == "--")
            return detail::Classifer::POSITIONAL_MARK;
        if(_valid_subcommand(current))
            return detail::Classifer::SUBCOMMAND;
        if(detail::split_long(current, dummy1, dummy2))
            return detail::Classifer::LONG;
        if(detail::split_short(current, dummy1, dummy2))
            return detail::Classifer::SHORT;
        return detail::Classifer::NONE;
    }